

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

FName MODtoDamageType(int mod)

{
  undefined4 uVar1;
  int in_ESI;
  undefined4 in_register_0000003c;
  
  uVar1 = 0;
  switch(in_ESI) {
  case 9:
    uVar1 = 0xc3;
    break;
  case 10:
  case 0xb:
  case 0x13:
  case 0x15:
    break;
  case 0xc:
    uVar1 = 0xba;
    break;
  case 0xd:
    uVar1 = 0xbb;
    break;
  case 0xe:
    uVar1 = 0x9f;
    break;
  case 0xf:
    uVar1 = 0x8b;
    break;
  case 0x10:
    uVar1 = 0xbc;
    break;
  case 0x11:
    uVar1 = 0xbd;
    break;
  case 0x12:
    uVar1 = 0xbe;
    break;
  case 0x14:
    uVar1 = 0xbf;
    break;
  case 0x16:
    uVar1 = 0x84;
    break;
  case 0x17:
    uVar1 = 0xc0;
    break;
  case 0x18:
    uVar1 = 0x33;
    break;
  case 0x19:
    uVar1 = 0x99;
    break;
  case 0x1a:
    uVar1 = 0xc1;
    break;
  case 0x1b:
    uVar1 = 0xc2;
    break;
  default:
    if (in_ESI == 1000) {
      uVar1 = 0xc5;
    }
  }
  *(undefined4 *)CONCAT44(in_register_0000003c,mod) = uVar1;
  return (FName)mod;
}

Assistant:

FName MODtoDamageType (int mod)
{
	switch (mod)
	{
	default:	return NAME_None;			break;
	case 9:		return NAME_BFGSplash;		break;
	case 12:	return NAME_Drowning;		break;
	case 13:	return NAME_Slime;			break;
	case 14:	return NAME_Fire;			break;
	case 15:	return NAME_Crush;			break;
	case 16:	return NAME_Telefrag;		break;
	case 17:	return NAME_Falling;		break;
	case 18:	return NAME_Suicide;		break;
	case 20:	return NAME_Exit;			break;
	case 22:	return NAME_Melee;			break;
	case 23:	return NAME_Railgun;		break;
	case 24:	return NAME_Ice;			break;
	case 25:	return NAME_Disintegrate;	break;
	case 26:	return NAME_Poison;			break;
	case 27:	return NAME_Electric;		break;
	case 1000:	return NAME_Massacre;		break;
	}
}